

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vao.cpp
# Opt level: O2

void anon_unknown.dwarf_12d8e7::upload_attribute
               (GLuint VAO,GLint dimension,GLint *data,int num_vertices,GLint location)

{
  uint __line;
  undefined8 in_RAX;
  undefined4 in_register_0000003c;
  char *__assertion;
  GLuint VBO;
  
  VBO = (GLuint)((ulong)in_RAX >> 0x20);
  if (location < 0) {
    std::operator<<((ostream *)&std::cerr,
                    "WARNING: Not uploading attribute with a negative location. The vertex shader doesn\'t declare or use this attribute. You need to re-launch if your set of declared or used vertex attributes changes.\n"
                   );
    return;
  }
  if (num_vertices < 1) {
    __assertion = "num_vertices > 0";
    __line = 0x3c;
  }
  else {
    if (data != (GLint *)0x0) {
      (*gl3wProcs.ptr[0x1a])(CONCAT44(in_register_0000003c,VAO));
      (*gl3wProcs.ptr[0xab])(1,&VBO);
      (*gl3wProcs.ptr[8])(0x8892,(ulong)VBO);
      (*gl3wProcs.ptr[0x28])
                (0x8892,(ulong)(uint)num_vertices * (ulong)(uint)dimension * 4,data,0x88e4);
      (*gl3wProcs.ptr[0x277])(location,(ulong)(uint)dimension,0x1404,0,0);
      (*gl3wProcs.ptr[0x98])(location);
      (*gl3wProcs.ptr[0x1a])(0);
      (*gl3wProcs.ptr[8])(0x8892,0);
      (*gl3wProcs.ptr[0x6a])(1,&VBO);
      return;
    }
    __assertion = "data";
    __line = 0x3d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/yig[P]graphics101-pipeline/src/vao.cpp"
                ,__line,
                "void (anonymous namespace)::upload_attribute(GLuint, GLint, const GLint *, int, GLint)"
               );
}

Assistant:

void upload_attribute( GLuint VAO, GLint dimension, const GLint* data, int num_vertices, GLint location )
{
    if( location < 0 ) {
        std::cerr << "WARNING: Not uploading attribute with a negative location. The vertex shader doesn't declare or use this attribute. You need to re-launch if your set of declared or used vertex attributes changes.\n";
        return;
    }
    
    assert( num_vertices > 0 );
    assert( data );
    
    // Bind the Vertex Array Object
	glBindVertexArray( VAO );
	
    // Generate a GPU buffer
	GLuint VBO;
	glGenBuffers( 1, &VBO );
	
	// Bind the buffer
	glBindBuffer( GL_ARRAY_BUFFER, VBO );
	// Upload the data
    glBufferData(
        GL_ARRAY_BUFFER,
        sizeof(GLint)*dimension*num_vertices,
        data,
        GL_STATIC_DRAW
        );
	
	// Attach the data to the given attribute ID
	glVertexAttribIPointer( location, dimension, GL_INT, 0, 0 );
    glEnableVertexAttribArray( location );
    
    // Unbind so we can delete the attribute buffer.
    glBindVertexArray( 0 );
    glBindBuffer( GL_ARRAY_BUFFER, 0 );
    // Delete the attribute buffer. This won't actually delete it until we delete the VAO.
    glDeleteBuffers( 1, &VBO );
}